

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-test.cpp
# Opt level: O0

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  ChannelFormat_t CVar4;
  long lVar5;
  allocator<char> local_51;
  string local_50;
  uint local_30;
  uint local_2c;
  ui32_t length_2;
  ui32_t length_1;
  ui32_t length;
  int i;
  char **argv_local;
  CommandOptions *pCStack_10;
  int argc_local;
  CommandOptions *this_local;
  
  this->mode = MMT_NONE;
  this->error_flag = true;
  this->key_flag = false;
  this->key_id_flag = false;
  this->asset_id_flag = false;
  this->encrypt_header_flag = true;
  this->write_hmac = true;
  this->read_hmac = false;
  this->split_wav = false;
  this->mono_wav = false;
  this->verbose_flag = false;
  this->fb_dump_size = 0;
  this->showindex_flag = false;
  this->showheader_flag = false;
  this->no_write_flag = false;
  this->version_flag = false;
  this->help_flag = false;
  this->stereo_image_flag = false;
  this->number_width = 6;
  this->start_frame = 0;
  this->duration = 0xffffffff;
  this->duration_flag = false;
  this->do_repeat = false;
  this->use_smpte_labels = false;
  this->j2c_pedantic = true;
  this->picture_rate = 0x18;
  this->fb_size = 0x400000;
  this->file_count = 0;
  this->file_root = (char *)0x0;
  this->out_file = (char *)0x0;
  this->channel_fmt = CF_NONE;
  _length = argv;
  argv_local._4_4_ = argc;
  pCStack_10 = this;
  memset(this->key_value,0,0x10);
  memset(this->key_id_value,0,0x10);
  length_1 = 1;
  do {
    if (argv_local._4_4_ <= (int)length_1) {
      if (((this->help_flag & 1U) == 0) && ((this->version_flag & 1U) == 0)) {
        if (((this->mode == MMT_INFO) ||
            ((((this->mode == MMT_CREATE || (this->mode == MMT_EXTRACT)) ||
              (this->mode == MMT_GOP_START)) || (this->mode == MMT_DIGEST)))) &&
           (this->file_count == 0)) {
          fputs("Option requires at least one filename argument.\n",_stderr);
        }
        else if (((this->mode == MMT_NONE) && ((this->help_flag & 1U) == 0)) &&
                ((this->version_flag & 1U) == 0)) {
          fputs("No operation selected (use one of -[gGcitux] or -h for help).\n",_stderr);
        }
        else {
          this->error_flag = false;
        }
      }
      return;
    }
    iVar3 = strcmp(_length[(int)length_1],"-help");
    if (iVar3 == 0) {
      this->help_flag = true;
    }
    else if (((*_length[(int)length_1] == '-') &&
             ((iVar3 = isalpha((int)_length[(int)length_1][1]), iVar3 != 0 ||
              (iVar3 = isdigit((int)_length[(int)length_1][1]), iVar3 != 0)))) &&
            (_length[(int)length_1][2] == '\0')) {
      switch(_length[(int)length_1][1]) {
      case '1':
        this->mono_wav = true;
        break;
      case '2':
        this->split_wav = true;
        break;
      case '3':
        this->stereo_image_flag = true;
        break;
      default:
        fprintf(_stderr,"Unrecognized option: %s\n",_length[(int)length_1]);
        return;
      case 'E':
        this->encrypt_header_flag = false;
        break;
      case 'G':
        this->mode = MMT_GOP_START;
        break;
      case 'H':
        this->showheader_flag = true;
        break;
      case 'L':
        this->use_smpte_labels = true;
        break;
      case 'M':
        this->write_hmac = false;
        break;
      case 'R':
        this->do_repeat = true;
        break;
      case 'S':
        this->split_wav = true;
        break;
      case 'U':
        this->mode = MMT_UL_LIST;
        break;
      case 'V':
        this->version_flag = true;
        break;
      case 'W':
        this->no_write_flag = true;
        break;
      case 'Z':
        this->j2c_pedantic = false;
        break;
      case 'a':
        this->asset_id_flag = true;
        length_1 = length_1 + 1;
        if ((argv_local._4_4_ <= (int)length_1) || (*_length[(int)length_1] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x61);
          return;
        }
        Kumu::hex2bin(_length[(int)length_1],this->asset_id_value,0x10,&length_2);
        if (length_2 != 0x10) {
          fprintf(_stderr,"Unexpected asset ID length: %u, expecting %u characters.\n",
                  (ulong)length_2,0x10);
          return;
        }
        break;
      case 'b':
        length_1 = length_1 + 1;
        if ((argv_local._4_4_ <= (int)length_1) || (*_length[(int)length_1] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x62);
          return;
        }
        lVar5 = strtol(_length[(int)length_1],(char **)0x0,10);
        lVar5 = Kumu::xabs<long>(lVar5);
        this->fb_size = (ui32_t)lVar5;
        if ((this->verbose_flag & 1U) != 0) {
          fprintf(_stderr,"Frame Buffer size: %u bytes.\n",(ulong)this->fb_size);
        }
        break;
      case 'c':
        length_1 = length_1 + 1;
        if ((argv_local._4_4_ <= (int)length_1) || (*_length[(int)length_1] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",99);
          return;
        }
        this->mode = MMT_CREATE;
        this->out_file = _length[(int)length_1];
        break;
      case 'd':
        length_1 = length_1 + 1;
        if ((argv_local._4_4_ <= (int)length_1) || (*_length[(int)length_1] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",100);
          return;
        }
        this->duration_flag = true;
        lVar5 = strtol(_length[(int)length_1],(char **)0x0,10);
        lVar5 = Kumu::xabs<long>(lVar5);
        this->duration = (ui32_t)lVar5;
        break;
      case 'e':
        this->encrypt_header_flag = true;
        break;
      case 'f':
        length_1 = length_1 + 1;
        if ((argv_local._4_4_ <= (int)length_1) || (*_length[(int)length_1] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x66);
          return;
        }
        lVar5 = strtol(_length[(int)length_1],(char **)0x0,10);
        lVar5 = Kumu::xabs<long>(lVar5);
        this->start_frame = (ui32_t)lVar5;
        break;
      case 'g':
        this->mode = MMT_GEN_KEY;
        break;
      case 'h':
        this->help_flag = true;
        break;
      case 'i':
        this->mode = MMT_INFO;
        break;
      case 'j':
        this->key_id_flag = true;
        length_1 = length_1 + 1;
        if ((argv_local._4_4_ <= (int)length_1) || (*_length[(int)length_1] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x6a);
          return;
        }
        Kumu::hex2bin(_length[(int)length_1],this->key_id_value,0x10,&local_2c);
        if (local_2c != 0x10) {
          fprintf(_stderr,"Unexpected key ID length: %u, expecting %u characters.\n",(ulong)local_2c
                  ,0x10);
          return;
        }
        break;
      case 'k':
        this->key_flag = true;
        length_1 = length_1 + 1;
        if ((argv_local._4_4_ <= (int)length_1) || (*_length[(int)length_1] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x6b);
          return;
        }
        Kumu::hex2bin(_length[(int)length_1],this->key_value,0x10,&local_30);
        if (local_30 != 0x10) {
          fprintf(_stderr,"Unexpected key length: %u, expecting %u characters.\n",(ulong)local_30,
                  0x10);
          return;
        }
        break;
      case 'l':
        length_1 = length_1 + 1;
        if ((argv_local._4_4_ <= (int)length_1) || (*_length[(int)length_1] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x6c);
          return;
        }
        pcVar2 = _length[(int)length_1];
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar2,&local_51);
        CVar4 = decode_channel_fmt(&local_50);
        this->channel_fmt = CVar4;
        std::__cxx11::string::~string((string *)&local_50);
        std::allocator<char>::~allocator(&local_51);
        break;
      case 'm':
        this->read_hmac = true;
        break;
      case 'n':
        this->showindex_flag = true;
        break;
      case 'p':
        length_1 = length_1 + 1;
        if ((argv_local._4_4_ <= (int)length_1) || (*_length[(int)length_1] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x70);
          return;
        }
        lVar5 = strtol(_length[(int)length_1],(char **)0x0,10);
        lVar5 = Kumu::xabs<long>(lVar5);
        this->picture_rate = (ui32_t)lVar5;
        break;
      case 's':
        length_1 = length_1 + 1;
        if ((argv_local._4_4_ <= (int)length_1) || (*_length[(int)length_1] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x73);
          return;
        }
        lVar5 = strtol(_length[(int)length_1],(char **)0x0,10);
        lVar5 = Kumu::xabs<long>(lVar5);
        this->fb_dump_size = (ui32_t)lVar5;
        break;
      case 't':
        this->mode = MMT_DIGEST;
        break;
      case 'u':
        this->mode = MMT_GEN_ID;
        break;
      case 'v':
        this->verbose_flag = true;
        break;
      case 'w':
        length_1 = length_1 + 1;
        if ((argv_local._4_4_ <= (int)length_1) || (*_length[(int)length_1] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x77);
          return;
        }
        lVar5 = strtol(_length[(int)length_1],(char **)0x0,10);
        lVar5 = Kumu::xabs<long>(lVar5);
        this->number_width = (ui32_t)lVar5;
        break;
      case 'x':
        length_1 = length_1 + 1;
        if ((argv_local._4_4_ <= (int)length_1) || (*_length[(int)length_1] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x78);
          return;
        }
        this->mode = MMT_EXTRACT;
        this->file_root = _length[(int)length_1];
        break;
      case 'z':
        this->j2c_pedantic = true;
      }
    }
    else {
      if (*_length[(int)length_1] == '-') {
        fprintf(_stderr,"Unrecognized argument: %s\n",_length[(int)length_1]);
        return;
      }
      pcVar2 = _length[(int)length_1];
      uVar1 = this->file_count;
      this->file_count = uVar1 + 1;
      this->filenames[uVar1] = pcVar2;
      if (0xf < this->file_count) {
        fprintf(_stderr,"Filename lists exceeds maximum list size: %u\n",0x10);
        return;
      }
    }
    length_1 = length_1 + 1;
  } while( true );
}

Assistant:

CommandOptions(int argc, const char** argv) :
    mode(MMT_NONE), error_flag(true), key_flag(false), key_id_flag(false), asset_id_flag(false),
    encrypt_header_flag(true), write_hmac(true), read_hmac(false), split_wav(false), mono_wav(false),
    verbose_flag(false), fb_dump_size(0), showindex_flag(false), showheader_flag(false),
    no_write_flag(false), version_flag(false), help_flag(false), stereo_image_flag(false),
    number_width(6), start_frame(0),
    duration(0xffffffff), duration_flag(false), do_repeat(false), use_smpte_labels(false), j2c_pedantic(true),
    picture_rate(24), fb_size(FRAME_BUFFER_SIZE), file_count(0), file_root(0), out_file(0),
    channel_fmt(PCM::CF_NONE)
  {
    memset(key_value, 0, KeyLen);
    memset(key_id_value, 0, UUIDlen);

    for ( int i = 1; i < argc; i++ )
      {

	if ( (strcmp( argv[i], "-help") == 0) )
	  {
	    help_flag = true;
	    continue;
	  }
         
	if ( argv[i][0] == '-'
	     && ( isalpha(argv[i][1]) || isdigit(argv[i][1]) )
	     && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case '1': mono_wav = true; break;
	      case '2': split_wav = true; break;
	      case '3': stereo_image_flag = true; break;

	      case 'a':
		asset_id_flag = true;
		TEST_EXTRA_ARG(i, 'a');
		{
		  ui32_t length;
		  Kumu::hex2bin(argv[i], asset_id_value, UUIDlen, &length);

		  if ( length != UUIDlen )
		    {
		      fprintf(stderr, "Unexpected asset ID length: %u, expecting %u characters.\n", length, UUIDlen);
		      return;
		    }
		}
		break;

	      case 'b':
		TEST_EXTRA_ARG(i, 'b');
		fb_size = Kumu::xabs(strtol(argv[i], 0, 10));

		if ( verbose_flag )
		  fprintf(stderr, "Frame Buffer size: %u bytes.\n", fb_size);

		break;

	      case 'c':
		TEST_EXTRA_ARG(i, 'c');
		mode = MMT_CREATE;
		out_file = argv[i];
		break;

	      case 'd':
		TEST_EXTRA_ARG(i, 'd');
		duration_flag = true;
		duration = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'E': encrypt_header_flag = false; break;
	      case 'e': encrypt_header_flag = true; break;

	      case 'f':
		TEST_EXTRA_ARG(i, 'f');
		start_frame = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'G': mode = MMT_GOP_START; break;
	      case 'g': mode = MMT_GEN_KEY; break;
	      case 'H': showheader_flag = true; break;
	      case 'h': help_flag = true; break;
	      case 'i': mode = MMT_INFO;	break;

	      case 'j': key_id_flag = true;
		TEST_EXTRA_ARG(i, 'j');
		{
		  ui32_t length;
		  Kumu::hex2bin(argv[i], key_id_value, UUIDlen, &length);

		  if ( length != UUIDlen )
		    {
		      fprintf(stderr, "Unexpected key ID length: %u, expecting %u characters.\n", length, UUIDlen);
		      return;
		    }
		}
		break;

	      case 'k': key_flag = true;
		TEST_EXTRA_ARG(i, 'k');
		{
		  ui32_t length;
		  Kumu::hex2bin(argv[i], key_value, KeyLen, &length);

		  if ( length != KeyLen )
		    {
		      fprintf(stderr, "Unexpected key length: %u, expecting %u characters.\n", length, KeyLen);
		      return;
		    }
		}
		break;

	      case 'l':
		TEST_EXTRA_ARG(i, 'l');
		channel_fmt = decode_channel_fmt(argv[i]);
		break;

	      case 'L': use_smpte_labels = true; break;
	      case 'M': write_hmac = false; break;
	      case 'm': read_hmac = true; break;
	      case 'n': showindex_flag = true; break;

	      case 'p':
		TEST_EXTRA_ARG(i, 'p');
		picture_rate = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'R': do_repeat = true; break;
	      case 'S': split_wav = true; break;

	      case 's':
		TEST_EXTRA_ARG(i, 's');
		fb_dump_size = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 't': mode = MMT_DIGEST; break;
	      case 'U':	mode = MMT_UL_LIST; break;
	      case 'u':	mode = MMT_GEN_ID; break;
	      case 'V': version_flag = true; break;
	      case 'v': verbose_flag = true; break;
	      case 'W': no_write_flag = true; break;

	      case 'w':
		TEST_EXTRA_ARG(i, 'w');
		number_width = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'x':
		TEST_EXTRA_ARG(i, 'x');
		mode = MMT_EXTRACT;
		file_root = argv[i];
		break;

	      case 'Z': j2c_pedantic = false; break;
	      case 'z': j2c_pedantic = true; break;

	      default:
		fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		return;
	      }
	  }
	else
	  {

	    if ( argv[i][0] != '-' )
	      {
		filenames[file_count++] = argv[i];
	      }
	    else
	      {
		fprintf(stderr, "Unrecognized argument: %s\n", argv[i]);
		return;
	      }

	    if ( file_count >= MAX_IN_FILES )
	      {
		fprintf(stderr, "Filename lists exceeds maximum list size: %u\n", MAX_IN_FILES);
		return;
	      }
	  }
      }

    if ( help_flag || version_flag )
      return;
    
    if ( ( mode == MMT_INFO
	   || mode == MMT_CREATE
	   || mode == MMT_EXTRACT
	   || mode == MMT_GOP_START
	   || mode == MMT_DIGEST ) && file_count == 0 )
      {
	fputs("Option requires at least one filename argument.\n", stderr);
	return;
      }

    if ( mode == MMT_NONE && ! help_flag && ! version_flag )
      {
	fputs("No operation selected (use one of -[gGcitux] or -h for help).\n", stderr);
	return;
      }

    error_flag = false;
  }